

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigint.hpp
# Opt level: O0

void __thiscall
jsoncons::basic_bigint<std::allocator<unsigned_char>_>::reserve
          (basic_bigint<std::allocator<unsigned_char>_> *this,size_type n)

{
  byte bVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  bool bVar4;
  size_type sVar5;
  ulong in_RSI;
  basic_bigint<std::allocator<unsigned_char>_> *in_RDI;
  uint64_t values [2];
  size_type is_neg;
  size_type size;
  basic_bigint_base<std::allocator<unsigned_char>_> *in_stack_ffffffffffffff78;
  basic_bigint<std::allocator<unsigned_char>_> *in_stack_ffffffffffffff80;
  real_allocator_type *in_stack_ffffffffffffffb0;
  size_type in_stack_ffffffffffffffb8;
  dynamic_storage *in_stack_ffffffffffffffc0;
  
  sVar5 = capacity(in_stack_ffffffffffffff80);
  if (sVar5 < in_RSI) {
    bVar4 = is_dynamic(in_RDI);
    if (bVar4) {
      detail::basic_bigint_base<std::allocator<unsigned_char>_>::get_allocator
                ((basic_bigint_base<std::allocator<unsigned_char>_> *)
                 &(in_RDI->field_0).common_stor_);
      dynamic_storage::reserve
                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
      std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x19fdc2);
    }
    else {
      sVar5 = (in_RDI->field_0).common_stor_.length_;
      bVar1 = *(byte *)&in_RDI->field_0;
      uVar2 = (in_RDI->field_0).short_stor_.values_[0];
      uVar3 = (in_RDI->field_0).short_stor_.values_[1];
      dynamic_storage::dynamic_storage(&(in_RDI->field_0).dynamic_stor_);
      detail::basic_bigint_base<std::allocator<unsigned_char>_>::get_allocator
                (in_stack_ffffffffffffff78);
      dynamic_storage::reserve
                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
      std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x19fd20);
      (in_RDI->field_0).common_stor_.length_ = sVar5;
      *(byte *)&in_RDI->field_0 = *(byte *)&in_RDI->field_0 & 0xfd | (bVar1 >> 1 & 1) << 1;
      *(in_RDI->field_0).dynamic_stor_.data_ = uVar2;
      *(uint64_t *)((in_RDI->field_0).short_stor_.values_[1] + 8) = uVar3;
    }
  }
  return;
}

Assistant:

void reserve(size_type n)
    {
       if (capacity() < n)
       {
           if (!is_dynamic())
           {
               size_type size = short_stor_.length_;
               size_type is_neg = short_stor_.is_negative_;
               uint64_t values[max_short_storage_size] = {short_stor_.values_[0], short_stor_.values_[1]};

               ::new (&dynamic_stor_) dynamic_storage();
               dynamic_stor_.reserve(n, get_allocator());
               dynamic_stor_.length_ = size;
               dynamic_stor_.is_negative_ = is_neg;
               dynamic_stor_.data_[0] = values[0];
               dynamic_stor_.data_[1] = values[1];
           }
           else
           {
               dynamic_stor_.reserve(n, get_allocator());
           }
       }
    }